

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void MOJOSHADER_freePreprocessData(MOJOSHADER_preprocessData *_data)

{
  void *pvVar1;
  MOJOSHADER_free local_38;
  int local_2c;
  int i;
  void *d;
  MOJOSHADER_free f;
  MOJOSHADER_preprocessData *data;
  MOJOSHADER_preprocessData *_data_local;
  
  if ((_data != (MOJOSHADER_preprocessData *)0x0) && (_data != &out_of_mem_data_preprocessor)) {
    if (_data->free == (MOJOSHADER_free)0x0) {
      local_38 = MOJOSHADER_internal_free;
    }
    else {
      local_38 = _data->free;
    }
    pvVar1 = _data->malloc_data;
    (*local_38)(_data->output,pvVar1);
    for (local_2c = 0; local_2c < _data->error_count; local_2c = local_2c + 1) {
      (*local_38)(_data->errors[local_2c].error,pvVar1);
      (*local_38)(_data->errors[local_2c].filename,pvVar1);
    }
    (*local_38)(_data->errors,pvVar1);
    (*local_38)(_data,pvVar1);
  }
  return;
}

Assistant:

void MOJOSHADER_freePreprocessData(const MOJOSHADER_preprocessData *_data)
{
    MOJOSHADER_preprocessData *data = (MOJOSHADER_preprocessData *) _data;
    if ((data == NULL) || (data == &out_of_mem_data_preprocessor))
        return;

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    f((void *) data->output, d);

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f(data->errors, d);

    f(data, d);
}